

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O0

bool chibi_generate(char *in_cwd,char *src_path,char *dst_path,char **targets,int numTargets,
                   char *platform)

{
  bool bVar1;
  size_t *this;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  char *local_4168;
  char local_4138 [8];
  char output_filename [4096];
  ChibiLibrary *library;
  iterator __end1;
  iterator __begin1;
  vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *__range1;
  char local_3108 [4];
  int num_build_targets;
  char build_root [4096];
  char source_path [4096];
  char local_10f8 [8];
  char cwd [4096];
  allocator local_c9;
  string local_c8 [36];
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  ChibiInfo chibi_info;
  char *platform_local;
  int numTargets_local;
  char **targets_local;
  char *dst_path_local;
  char *src_path_local;
  char *in_cwd_local;
  
  chibi_info.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)platform;
  ChibiInfo::ChibiInfo((ChibiInfo *)local_a0);
  for (local_a4 = 0; local_a4 < numTargets; local_a4 = local_a4 + 1) {
    pcVar2 = targets[local_a4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar2,&local_c9);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0,(value_type *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  if ((in_cwd == (char *)0x0) || (*in_cwd == '\0')) {
    bVar1 = get_current_working_directory(local_10f8,0x1000);
    if (!bVar1) {
      report_error((char *)0x0,"failed to get current working directory");
      in_cwd_local._7_1_ = false;
      goto LAB_001276e3;
    }
  }
  else {
    bVar1 = chibi::copy_string(local_10f8,0x1000,in_cwd);
    if (!bVar1) {
      report_error((char *)0x0,"failed to copy cwd string");
      in_cwd_local._7_1_ = false;
      goto LAB_001276e3;
    }
  }
  bVar1 = create_absolute_path_given_cwd(local_10f8,src_path,build_root + 0xff8,0x1000);
  if (bVar1) {
    bVar1 = find_chibi_build_root(build_root + 0xff8,local_3108,0x1000);
    if (bVar1) {
      printf("source_path: %s\n",build_root + 0xff8);
      printf("destination_path: %s\n",dst_path);
      printf("build_root: %s\n",local_3108);
      bVar1 = chibi_process((ChibiInfo *)local_a0,local_3108,false,
                            (char *)chibi_info.cmake_module_paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        __range1._4_4_ = 0;
        this = &chibi_info.build_targets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1 = std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::begin
                           ((vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *)this);
        library = (ChibiLibrary *)
                  std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::end
                            ((vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *)this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
                                           *)&library), bVar1) {
          __gnu_cxx::
          __normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
          ::operator*(&__end1);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          bVar1 = ChibiInfo::should_build_target((ChibiInfo *)local_a0,pcVar2);
          if (bVar1) {
            __range1._4_4_ = __range1._4_4_ + 1;
          }
          __gnu_cxx::
          __normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
          ::operator++(&__end1);
        }
        sVar3 = std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::size
                          ((vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *)
                           &chibi_info.build_targets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        printf("found %d libraries and apps in total, of which %d marked as target\n",
               sVar3 & 0xffffffff,(ulong)__range1._4_4_);
        bVar1 = chibi::concat(local_4138,0x1000,dst_path,"/","CMakeLists.txt",(char *)0x0);
        if (bVar1) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_4168 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_4168 = (char *)std::__cxx11::string::c_str();
          }
          bVar1 = chibi::write_cmake_file((ChibiInfo *)local_a0,local_4168,local_4138);
          if (bVar1) {
            bVar1 = is_platform("android");
            if ((!bVar1) ||
               (bVar1 = chibi::write_gradle_files((ChibiInfo *)local_a0,dst_path), bVar1)) {
              in_cwd_local._7_1_ = true;
            }
            else {
              report_error((char *)0x0,"an error occured while generating gradle files");
              in_cwd_local._7_1_ = false;
            }
          }
          else {
            report_error((char *)0x0,"an error occured while generating cmake file");
            in_cwd_local._7_1_ = false;
          }
        }
        else {
          report_error((char *)0x0,"failed to create absolute path");
          in_cwd_local._7_1_ = false;
        }
      }
      else {
        in_cwd_local._7_1_ = false;
      }
    }
    else {
      report_error((char *)0x0,"failed to find chibi-root.txt file");
      in_cwd_local._7_1_ = false;
    }
  }
  else {
    report_error((char *)0x0,"failed to create absolute path");
    in_cwd_local._7_1_ = false;
  }
LAB_001276e3:
  ChibiInfo::~ChibiInfo((ChibiInfo *)local_a0);
  return in_cwd_local._7_1_;
}

Assistant:

bool chibi_generate(const char * in_cwd, const char * src_path, const char * dst_path, const char ** targets, const int numTargets, const char * platform)
{
	ChibiInfo chibi_info;
	
	for (int i = 0; i < numTargets; ++i)
		chibi_info.build_targets.insert(targets[i]);
	
	//
	
	char cwd[PATH_MAX];
	
	if (in_cwd == nullptr || in_cwd[0] == 0)
	{
		// get the current working directory. this is the root of our operations

		if (get_current_working_directory(cwd, sizeof(cwd)) == false)
		{
			report_error(nullptr, "failed to get current working directory");
			return false;
		}
	}
	else
	{
		if (!copy_string(cwd, sizeof(cwd), in_cwd))
		{
			report_error(nullptr, "failed to copy cwd string");
			return false;
		}
	}
	
	//
	
	char source_path[PATH_MAX];
	
	if (create_absolute_path_given_cwd(cwd, src_path, source_path, sizeof(source_path)) == false)
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}

	
	// recursively find build_root
	
	char build_root[PATH_MAX];
	
	if (find_chibi_build_root(source_path, build_root, sizeof(build_root)) == false)
	{
		report_error(nullptr, "failed to find chibi-root.txt file");
		return false;
	}
	
#if 1
	printf("source_path: %s\n", source_path);
	printf("destination_path: %s\n", dst_path);
	printf("build_root: %s\n", build_root);
#endif

	if (chibi_process(chibi_info, build_root, false, platform) == false)
		return false;
	
	int num_build_targets = 0;
	for (auto * library : chibi_info.libraries)
		if (chibi_info.should_build_target(library->name.c_str()))
			num_build_targets++;
		
	printf("found %d libraries and apps in total, of which %d marked as target\n", (int)chibi_info.libraries.size(), num_build_targets);
	
	// write cmake file
	
	char output_filename[PATH_MAX];
	
	if (!concat(output_filename, sizeof(output_filename), dst_path, "/", "CMakeLists.txt"))
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}
	
	if (!write_cmake_file(
		chibi_info,
		!s_platform_full.empty()
			? s_platform_full.c_str()
			: s_platform.c_str(),
		output_filename))
	{
		report_error(nullptr, "an error occured while generating cmake file");
		return false;
	}

	// write gradle files
	
	if (is_platform("android"))
	{
		if (!write_gradle_files(chibi_info, dst_path))
		{
			report_error(nullptr, "an error occured while generating gradle files");
			return false;
		}
	}

	return true;
}